

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O0

word wwShLoCarry(word *a,size_t n,size_t shift,word carry)

{
  ulong uVar1;
  ulong uVar2;
  sbyte sVar3;
  ulong in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  word *in_RDI;
  size_t pos;
  size_t wshift;
  word ret;
  ulong local_38;
  ulong local_28;
  
  local_28 = 0;
  if (in_RDX < (in_RSI + 1) * 0x40) {
    uVar1 = in_RDX >> 6;
    sVar3 = (sbyte)(in_RDX & 0x3f);
    if (uVar1 != 0) {
      local_28 = in_RDI[uVar1 - 1] >> sVar3;
    }
    if ((in_RDX & 0x3f) == 0) {
      for (local_38 = 0; local_38 + uVar1 < in_RSI; local_38 = local_38 + 1) {
        in_RDI[local_38] = in_RDI[local_38 + uVar1];
      }
    }
    else {
      if (uVar1 < in_RSI) {
        uVar2 = in_RDI[uVar1] << (0x40U - sVar3 & 0x3f);
      }
      else {
        uVar2 = in_RCX << (0x40U - sVar3 & 0x3f);
      }
      local_28 = uVar2 | local_28;
      for (local_38 = 0; local_38 + uVar1 + 1 < in_RSI; local_38 = local_38 + 1) {
        in_RDI[local_38] =
             in_RDI[local_38 + uVar1] >> sVar3 |
             in_RDI[local_38 + uVar1 + 1] << (0x40U - sVar3 & 0x3f);
      }
      if (local_38 + uVar1 < in_RSI) {
        in_RDI[local_38] = in_RDI[local_38 + uVar1] >> sVar3 | in_RCX << (0x40U - sVar3 & 0x3f);
        local_38 = local_38 + 1;
      }
    }
    if (local_38 < in_RSI) {
      in_RDI[local_38] = in_RCX >> sVar3;
      local_38 = local_38 + 1;
    }
    while (local_38 < in_RSI) {
      in_RDI[local_38] = 0;
      local_38 = local_38 + 1;
    }
  }
  else {
    wwSetZero(in_RDI,in_RSI);
    uVar1 = in_RDX + (in_RSI + 1) * -0x40;
    if (uVar1 < 0x40) {
      local_28 = in_RCX >> ((byte)uVar1 & 0x3f);
    }
  }
  return local_28;
}

Assistant:

word wwShLoCarry(word a[], size_t n, size_t shift, word carry)
{
	register word ret = 0;
	ASSERT(wwIsValid(a, n));
	if (shift < B_PER_W * (n + 1))
	{
		size_t wshift = shift / B_PER_W, pos;
		shift %= B_PER_W;
		// сохраняем вытесняемые разряды
		if (wshift)
			ret = a[wshift - 1] >> shift;
		// величина сдвига не кратна длине слова?
		if (shift)
		{
			// дополнительные вытесняемые разряды
			if (wshift < n)
				ret |= a[wshift] << (B_PER_W - shift);
			else
				ret |= carry << (B_PER_W - shift);
			// сдвиг всех слов, кроме последнего
			for (pos = 0; pos + wshift + 1 < n; pos++)
				a[pos] = a[pos + wshift] >> shift |
					a[pos + wshift + 1] << (B_PER_W - shift);
			// предпоследнее слово
			if (pos + wshift < n)
			{
				a[pos] = a[pos + wshift] >> shift | carry << (B_PER_W - shift);
				++pos;
			}
		}
		// величина сдвига кратна длине слова
		else
		{
			for (pos = 0; pos + wshift < n; pos++)
				a[pos] = a[pos + wshift];
		}
		// последние слова
		if (pos < n)
			a[pos++] = carry >> shift;
		for (; pos < n; a[pos++] = 0);
	}
	else
	{
		wwSetZero(a, n);
		shift -= B_PER_W * (n + 1);
		if (shift < B_PER_W)
			ret = carry >> shift;
	}
	return ret;
}